

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::EnumValueDescriptorProto::SerializeWithCachedSizesToArray
          (EnumValueDescriptorProto *this,uint8 *target)

{
  bool bVar1;
  int size;
  int32 value;
  uint32 uVar2;
  char *data;
  string *str;
  EnumValueOptions *this_00;
  uint8 *puVar3;
  UnknownFieldSet *pUVar4;
  byte *local_e0;
  uint8 *target_local;
  EnumValueDescriptorProto *this_local;
  uint8 *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_name(this);
  local_e0 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,size,SERIALIZE);
    str = name_abi_cxx11_(this);
    uVar2 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar2 < 0x80) {
      *target = (byte)uVar2;
      local_40 = target + 1;
    }
    else if (uVar2 < 0x4000) {
      *target = (byte)uVar2 | 0x80;
      target[1] = (uint8)(uVar2 >> 7);
      local_40 = target + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,target);
    }
    uVar2 = std::__cxx11::string::size();
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_40);
    local_e0 = io::CodedOutputStream::WriteStringToArray(str,puVar3);
  }
  bVar1 = has_number(this);
  if (bVar1) {
    value = number(this);
    uVar2 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    if (uVar2 < 0x80) {
      *local_e0 = (byte)uVar2;
      local_28 = local_e0 + 1;
    }
    else if (uVar2 < 0x4000) {
      *local_e0 = (byte)uVar2 | 0x80;
      local_e0[1] = (byte)(uVar2 >> 7);
      local_28 = local_e0 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,local_e0);
    }
    local_e0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,local_28);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    this_00 = options(this);
    uVar2 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar2 < 0x80) {
      *local_e0 = (byte)uVar2;
      local_10 = local_e0 + 1;
    }
    else if (uVar2 < 0x4000) {
      *local_e0 = (byte)uVar2 | 0x80;
      local_e0[1] = (byte)(uVar2 >> 7);
      local_10 = local_e0 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,local_e0);
    }
    uVar2 = EnumValueOptions::GetCachedSize(this_00);
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_10);
    local_e0 = EnumValueOptions::SerializeWithCachedSizesToArray(this_00,puVar3);
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    local_e0 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar4,local_e0);
  }
  return local_e0;
}

Assistant:

::google::protobuf::uint8* EnumValueDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional int32 number = 2;
  if (has_number()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->number(), target);
  }

  // optional .google.protobuf.EnumValueOptions options = 3;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}